

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std.cpp
# Opt level: O3

int lib_atoi_adv(char **str,size_t *len)

{
  char cVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  
  iVar3 = 0;
  if (*len == 0) {
    iVar2 = 1;
    goto LAB_001f3395;
  }
  cVar1 = **str;
  if (cVar1 == '-') {
    iVar2 = -1;
LAB_001f3365:
    *str = *str + 1;
    *len = *len - 1;
    if (*len == 0) goto LAB_001f3395;
  }
  else {
    iVar2 = 1;
    if (cVar1 == '+') goto LAB_001f3365;
  }
  iVar3 = 0;
  do {
    uVar4 = (int)**str - 0x30;
    if (9 < uVar4) break;
    iVar3 = uVar4 + iVar3 * 10;
    *str = *str + 1;
    *len = *len - 1;
  } while (*len != 0);
LAB_001f3395:
  return iVar2 * iVar3;
}

Assistant:

int lib_atoi_adv(const char *&str, size_t &len)
{
    /* parse the sign, if present */
    int s = 1;
    if (len >= 1 && *str == '-')
        s = -1, ++str, --len;
    else if (len >= 1 && *str == '+')
        ++str, --len;

    /* scan digits */
    int acc;
    for (acc = 0 ; len > 0 && is_digit(*str) ;
         acc *= 10, acc += value_of_digit(*str), ++str, --len) ;

    /* apply the sign and return the result */
    return s * acc;
}